

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void groupConcatStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  u32 uVar2;
  sqlite3_value *psVar3;
  int iVar4;
  sqlite3_str *p;
  char *pcVar5;
  uchar *puVar6;
  int iVar7;
  ulong uVar8;
  
  psVar3 = *argv;
  uVar1._0_2_ = psVar3->flags;
  uVar1._2_1_ = psVar3->enc;
  uVar1._3_1_ = psVar3->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
    return;
  }
  p = (sqlite3_str *)sqlite3_aggregate_context(context,0x30);
  if (p == (sqlite3_str *)0x0) {
    return;
  }
  uVar2 = p->mxAlloc;
  p->mxAlloc = context->pOut->db->aLimit[0];
  if (argc == 1) {
    if (uVar2 == 0) {
      *(undefined4 *)((long)&p[1].db + 4) = 1;
    }
    else {
      sqlite3_str_appendchar(p,1,',');
    }
    goto LAB_001ba607;
  }
  if (uVar2 == 0) {
    iVar4 = sqlite3_value_bytes(argv[1]);
    *(int *)((long)&p[1].db + 4) = iVar4;
    goto LAB_001ba607;
  }
  puVar6 = sqlite3_value_text(argv[1]);
  iVar4 = sqlite3_value_bytes(argv[1]);
  if (puVar6 == (uchar *)0x0) {
    iVar4 = 0;
  }
  else {
    sqlite3_str_append(p,(char *)puVar6,iVar4);
  }
  pcVar5 = p[1].zText;
  if (iVar4 == *(int *)((long)&p[1].db + 4)) {
    if (pcVar5 == (char *)0x0) goto LAB_001ba607;
LAB_001ba5a0:
    pcVar5 = (char *)sqlite3_realloc64(pcVar5,(long)*(int *)&p[1].db << 2);
    if (pcVar5 == (char *)0x0) {
LAB_001ba5fc:
      sqlite3StrAccumSetError(p,'\a');
      goto LAB_001ba607;
    }
  }
  else {
    if (pcVar5 != (char *)0x0) goto LAB_001ba5a0;
    pcVar5 = (char *)sqlite3_malloc64((long)*(int *)&p[1].db * 4 + 4);
    if (pcVar5 == (char *)0x0) goto LAB_001ba5fc;
    iVar7 = 1;
    if (1 < *(int *)&p[1].db) {
      iVar7 = *(int *)&p[1].db;
    }
    for (uVar8 = 0; iVar7 - 1 != uVar8; uVar8 = uVar8 + 1) {
      *(undefined4 *)(pcVar5 + uVar8 * 4) = *(undefined4 *)((long)&p[1].db + 4);
    }
  }
  if (0 < *(int *)&p[1].db) {
    *(int *)(pcVar5 + (ulong)(*(int *)&p[1].db - 1) * 4) = iVar4;
  }
  p[1].zText = pcVar5;
LAB_001ba607:
  *(int *)&p[1].db = *(int *)&p[1].db + 1;
  puVar6 = sqlite3_value_text(*argv);
  iVar4 = sqlite3_value_bytes(*argv);
  if (puVar6 == (uchar *)0x0) {
    return;
  }
  sqlite3_str_append(p,(char *)puVar6,iVar4);
  return;
}

Assistant:

static void groupConcatStep(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *zVal;
  GroupConcatCtx *pGCC;
  const char *zSep;
  int nVal, nSep;
  assert( argc==1 || argc==2 );
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pGCC = (GroupConcatCtx*)sqlite3_aggregate_context(context, sizeof(*pGCC));
  if( pGCC ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    int firstTerm = pGCC->str.mxAlloc==0;
    pGCC->str.mxAlloc = db->aLimit[SQLITE_LIMIT_LENGTH];
    if( argc==1 ){
      if( !firstTerm ){
        sqlite3_str_appendchar(&pGCC->str, 1, ',');
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      else{
        pGCC->nFirstSepLength = 1;
      }
#endif
    }else if( !firstTerm ){
      zSep = (char*)sqlite3_value_text(argv[1]);
      nSep = sqlite3_value_bytes(argv[1]);
      if( zSep ){
        sqlite3_str_append(&pGCC->str, zSep, nSep);
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      else{
        nSep = 0;
      }
      if( nSep != pGCC->nFirstSepLength || pGCC->pnSepLengths != 0 ){
        int *pnsl = pGCC->pnSepLengths;
        if( pnsl == 0 ){
          /* First separator length variation seen, start tracking them. */
          pnsl = (int*)sqlite3_malloc64((pGCC->nAccum+1) * sizeof(int));
          if( pnsl!=0 ){
            int i = 0, nA = pGCC->nAccum-1;
            while( i<nA ) pnsl[i++] = pGCC->nFirstSepLength;
          }
        }else{
          pnsl = (int*)sqlite3_realloc64(pnsl, pGCC->nAccum * sizeof(int));
        }
        if( pnsl!=0 ){
          if( ALWAYS(pGCC->nAccum>0) ){
            pnsl[pGCC->nAccum-1] = nSep;
          }
          pGCC->pnSepLengths = pnsl;
        }else{
          sqlite3StrAccumSetError(&pGCC->str, SQLITE_NOMEM);
        }
      }
#endif
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    else{
      pGCC->nFirstSepLength = sqlite3_value_bytes(argv[1]);
    }
    pGCC->nAccum += 1;
#endif
    zVal = (char*)sqlite3_value_text(argv[0]);
    nVal = sqlite3_value_bytes(argv[0]);
    if( zVal ) sqlite3_str_append(&pGCC->str, zVal, nVal);
  }
}